

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void handle_busy_test(void)

{
  fdb_status fVar1;
  anomalous_callbacks *paVar2;
  size_t sVar3;
  void *meta;
  fdb_file_handle *in_stack_fffffffffffffcd8;
  anomalous_callbacks *in_stack_fffffffffffffce0;
  fdb_iterator *in_stack_fffffffffffffce8;
  size_t in_stack_fffffffffffffd00;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  anomalous_callbacks *write_hang_cb;
  fdb_kvs_handle *pfStack_d0;
  fdb_status status;
  fdb_iterator *itr;
  fdb_kvs_handle *db;
  shared_data data;
  fdb_doc **doc;
  char bodybuf [16];
  char metabuf [16];
  char keybuf [16];
  uint local_60;
  int r;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  data._24_8_ = &stack0xfffffffffffffcd8;
  paVar2 = get_default_anon_cbs();
  paVar2->pwrite_cb = pwrite_hang_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  memset(&db,0,0x20);
  filemgr_ops_anomalous_init(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar1 = fdb_open((fdb_file_handle **)fconfig.breakpad_minidump_dir,
                   (char *)fconfig.num_keeping_headers,(fdb_config *)fconfig.max_block_reusing_cycle
                  );
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1b2);
    handle_busy_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x1b2,"void handle_busy_test()");
    }
  }
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)in_stack_fffffffffffffce0,&in_stack_fffffffffffffcd8->root,
                     (fdb_kvs_config *)0x10762c);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x1b4);
    handle_busy_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x1b4,"void handle_busy_test()");
    }
  }
  itr = (fdb_iterator *)data.dbfile;
  local_60 = 0;
  do {
    if (0x1f < (int)local_60) {
      fVar1 = fdb_commit(in_stack_fffffffffffffcd8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x1c5);
        handle_busy_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x1c5,"void handle_busy_test()");
        }
      }
      fVar1 = fdb_iterator_init((fdb_kvs_handle *)itr,(fdb_iterator **)&stack0xffffffffffffff30,
                                (void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x1c9);
        handle_busy_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x1c9,"void handle_busy_test()");
        }
      }
      data.iterator._0_1_ = 1;
      fVar1 = fdb_set((fdb_kvs_handle *)itr,*(fdb_doc **)data._24_8_);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x1ce);
        handle_busy_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x1ce,"void handle_busy_test()");
        }
      }
      data.db = pfStack_d0;
      fdb_iterator_close(in_stack_fffffffffffffce8);
      data.iterator._0_1_ = 0;
      fdb_close(in_stack_fffffffffffffcd8);
      for (local_60 = 0x1f; -1 < (int)local_60; local_60 = local_60 + -1) {
        fdb_doc_free((fdb_doc *)0x107a24);
      }
      fdb_shutdown();
      memleak_end();
      if (handle_busy_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","Handle Busy Test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","Handle Busy Test");
      }
      return;
    }
    sprintf(metabuf + 8,"key%d",(ulong)local_60);
    sprintf(bodybuf + 8,"meta%d",(ulong)local_60);
    sprintf((char *)&doc,"body%d",(ulong)local_60);
    strlen(metabuf + 8);
    strlen(bodybuf + 8);
    meta = (void *)0x107769;
    sVar3 = strlen((char *)&doc);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                   (size_t)in_stack_fffffffffffffcd8,meta,sVar3 + 1,(void *)0x1077a4,
                   in_stack_fffffffffffffd00);
    fVar1 = fdb_set((fdb_kvs_handle *)itr,*(fdb_doc **)(data._24_8_ + (long)(int)local_60 * 8));
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x1c0);
      handle_busy_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x1c0,"void handle_busy_test()");
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void handle_busy_test()
{
    TEST_INIT();

    memleak_start();

    int n = 32;
    int i = 0, r;

    char keybuf[16], metabuf[16], bodybuf[16];
    fdb_doc **doc = alca(fdb_doc *, n);
    struct shared_data data;
    fdb_kvs_handle *db;
    fdb_iterator *itr;
    fdb_status status;

    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_hang_cb = get_default_anon_cbs();

    // Modify the pwrite callback to redirect to test-specific function
    write_hang_cb->pwrite_cb = &pwrite_hang_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    memset(&data, 0, sizeof(struct shared_data));

    // Create anomalous behavior with shared handle for the callback ctx
    filemgr_ops_anomalous_init(write_hang_cb, &data);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&data.dbfile, "anomaly_test5", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(data.dbfile, &data.db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    db = data.db;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1,
            (void*)metabuf, strlen(metabuf) + 1, (void*)bodybuf,
            strlen(bodybuf) + 1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(data.dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_iterator_init(db, &itr, NULL, 0, NULL, 0,
                               FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Set callback context to call bad_thread() and do a set invoking callback
    data.test_handle_busy = 1;
    status = fdb_set(db, doc[0]);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test iterator callbacks by attemping a set call on the iterator handle..
    data.iterator = itr;
    // TODO: remove if concurrent access on iterator handle can never happen
    //status = fdb_set(itr->handle, doc[0]);
    //TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_close(itr);
    data.test_handle_busy = 0;
    fdb_close(data.dbfile);

    for (i = n - 1; i >=0; --i) {
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Handle Busy Test");
}